

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall
ktx::CommandExtract::OptionsExtract::process
          (OptionsExtract *this,Options *param_1,ParseResult *args,Reporter *report)

{
  byte bVar1;
  bool bVar2;
  __optional_eq_t<ktx::SelectorRange,_ktx::All_t> _Var3;
  size_t sVar4;
  OptionValue *pOVar5;
  bool *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  bool *found;
  string_view str;
  anon_class_16_2_501fead0 parseSelector;
  optional<ktx::SelectorRange> level;
  optional<ktx::SelectorRange> depth_;
  optional<ktx::SelectorRange> face;
  optional<ktx::SelectorRange> layer;
  allocator<char> local_131;
  string local_130;
  FragmentURI local_110;
  anon_class_16_2_501fead0 local_c8;
  _Optional_payload_base<ktx::SelectorRange> local_b8;
  bool *local_98;
  _Optional_payload_base<ktx::SelectorRange> local_90;
  _Optional_payload_base<ktx::SelectorRange> local_70;
  _Optional_payload_base<ktx::SelectorRange> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kOutput,(allocator<char> *)&local_b8);
  sVar4 = cxxopts::ParseResult::count(args,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (sVar4 == 0) {
    Reporter::fatal_usage<char_const(&)[39]>
              (report,(char (*) [39])"Missing output file or directory path.");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,kOutput,(allocator<char> *)&local_b8);
    pOVar5 = cxxopts::ParseResult::operator[](args,(string *)&local_110);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&local_110);
  }
  local_c8.args = args;
  local_c8.report = report;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kLevel,(allocator<char> *)&local_50);
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_b8,&local_c8,(string *)&local_110,
             &this->levelFlagUsed);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kLayer,(allocator<char> *)&local_70);
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_50,&local_c8,(string *)&local_110,
             &this->layerFlagUsed);
  local_98 = &this->layerFlagUsed;
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kFace,(allocator<char> *)&local_90);
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_70,&local_c8,(string *)&local_110,
             &this->faceFlagUsed);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kDepth,(allocator<char> *)&local_130);
  found = &this->depthFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_90,&local_c8,(string *)&local_110,found);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kRaw,(allocator<char> *)&local_130);
  pOVar5 = cxxopts::ParseResult::operator[](args,(string *)&local_110);
  pbVar6 = cxxopts::OptionValue::as<bool>(pOVar5);
  this->raw = *pbVar6;
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kAll,(allocator<char> *)&local_130);
  pOVar5 = cxxopts::ParseResult::operator[](args,(string *)&local_110);
  pbVar6 = cxxopts::OptionValue::as<bool>(pOVar5);
  this->globalAll = *pbVar6;
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = this->globalAll;
  if ((bool)bVar1 == true) {
    if (local_b8._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --level cannot be used with --all.");
    }
    if (local_50._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --layer cannot be used with --all.");
    }
    if (local_70._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[55]>
                (report,(char (*) [55])"Conflicting options: --face cannot be used with --all.");
    }
    if (local_90._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --depth cannot be used with --all.");
    }
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_b8,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_50,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_70,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_90,(All_t *)&all);
    bVar1 = this->globalAll;
  }
  if ((bVar1 & 1) != 0) {
    bVar2 = std::operator==(&this->outputPath,"-");
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[57]>
                (report,(char (*) [57])"stdout cannot be used with multi-output \'--all\' extract.")
      ;
    }
  }
  _Var3 = std::operator==((optional<ktx::SelectorRange> *)&local_b8,(All_t *)&all);
  if (_Var3) {
    bVar2 = std::operator==(&this->outputPath,"-");
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[63]>
                (report,(char (*) [63])
                        "stdout cannot be used with multi-output \'--level all\' extract.");
    }
  }
  _Var3 = std::operator==((optional<ktx::SelectorRange> *)&local_50,(All_t *)&all);
  if (_Var3) {
    bVar2 = std::operator==(&this->outputPath,"-");
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[63]>
                (report,(char (*) [63])
                        "stdout cannot be used with multi-output \'--layer all\' extract.");
    }
  }
  _Var3 = std::operator==((optional<ktx::SelectorRange> *)&local_70,(All_t *)&all);
  if (_Var3) {
    bVar2 = std::operator==(&this->outputPath,"-");
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[62]>
                (report,(char (*) [62])
                        "stdout cannot be used with multi-output \'--face all\' extract.");
    }
  }
  _Var3 = std::operator==((optional<ktx::SelectorRange> *)&local_90,(All_t *)&all);
  if (_Var3) {
    bVar2 = std::operator==(&this->outputPath,"-");
    if (bVar2) {
      Reporter::fatal_usage<char_const(&)[63]>
                (report,(char (*) [63])
                        "stdout cannot be used with multi-output \'--depth all\' extract.");
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,kUri,(allocator<char> *)&local_130);
  pOVar5 = cxxopts::ParseResult::operator[](args,(string *)&local_110);
  sVar4 = pOVar5->m_count;
  std::__cxx11::string::~string((string *)&local_110);
  if (sVar4 == 0) {
    SelectorRange::SelectorRange((SelectorRange *)&local_130,0);
    std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
              (&local_110.mip,(optional<ktx::SelectorRange> *)&local_b8,(SelectorRange *)&local_130)
    ;
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    *)&this->fragmentURI);
    std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ::~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *)&local_110);
    std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ::~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *)&local_130);
    SelectorRange::SelectorRange((SelectorRange *)&local_130,0);
    std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
              (&local_110.mip,(optional<ktx::SelectorRange> *)&local_50,(SelectorRange *)&local_130)
    ;
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign(&(this->fragmentURI).stratal.ranges);
    std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ::~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *)&local_110);
    std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ::~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *)&local_130);
    SelectorRange::SelectorRange((SelectorRange *)&local_130,0);
    std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
              (&local_110.mip,(optional<ktx::SelectorRange> *)&local_70,(SelectorRange *)&local_130)
    ;
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign(&(this->fragmentURI).facial.ranges);
    std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ::~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *)&local_110);
    std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ::~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *)&local_130);
    goto LAB_00173ff6;
  }
  this->uriFlagUsed = true;
  if (this->globalAll == true) {
    Reporter::fatal_usage<char_const(&)[54]>
              (report,(char (*) [54])"Conflicting options: --all cannot be used with --uri.");
  }
  if (this->levelFlagUsed == true) {
    Reporter::fatal_usage<char_const(&)[56]>
              (report,(char (*) [56])"Conflicting options: --level cannot be used with --uri.");
  }
  if (*local_98 == true) {
    Reporter::fatal_usage<char_const(&)[56]>
              (report,(char (*) [56])"Conflicting options: --layer cannot be used with --uri.");
  }
  if (this->faceFlagUsed == true) {
    Reporter::fatal_usage<char_const(&)[55]>
              (report,(char (*) [55])"Conflicting options: --face cannot be used with --uri.");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,kUri,&local_131);
  pOVar5 = cxxopts::ParseResult::operator[](args,&local_130);
  pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
  str._M_str = found;
  str._M_len = (size_t)(pbVar7->_M_dataplus)._M_p;
  parseFragmentURI(&local_110,(ktx *)pbVar7->_M_string_length,str);
  FragmentURI::operator=(&this->fragmentURI,&local_110);
  FragmentURI::~FragmentURI(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  if ((this->fragmentURI).mip.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->fragmentURI).mip.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00173ec3:
    if ((this->fragmentURI).stratal.ranges.
        super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->fragmentURI).stratal.ranges.
        super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = SelectorRange::is_multi(&(this->fragmentURI).stratal);
      if (bVar2) goto LAB_00173ef9;
    }
    if ((this->fragmentURI).facial.ranges.
        super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->fragmentURI).facial.ranges.
        super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00173ff6;
    bVar2 = SelectorRange::is_multi(&(this->fragmentURI).facial);
    if (!bVar2) goto LAB_00173ff6;
  }
  else {
    bVar2 = SelectorRange::is_multi(&(this->fragmentURI).mip);
    if (!bVar2) goto LAB_00173ec3;
  }
LAB_00173ef9:
  bVar2 = std::operator==(&this->outputPath,"-");
  if (bVar2) {
    Reporter::fatal_usage<char_const(&)[57]>
              (report,(char (*) [57])"stdout cannot be used with multi-output \'--uri\' extract.");
  }
LAB_00173ff6:
  SelectorRange::SelectorRange((SelectorRange *)&local_130,0);
  std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
            (&local_110.mip,(optional<ktx::SelectorRange> *)&local_90,(SelectorRange *)&local_130);
  std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  _M_move_assign(&(this->depth).ranges,&local_110);
  std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  ~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                 *)&local_110);
  std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  ~_Vector_base((_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                 *)&local_130);
  std::_Optional_payload_base<ktx::SelectorRange>::_M_reset(&local_90);
  std::_Optional_payload_base<ktx::SelectorRange>::_M_reset(&local_70);
  std::_Optional_payload_base<ktx::SelectorRange>::_M_reset(&local_50);
  std::_Optional_payload_base<ktx::SelectorRange>::_M_reset(&local_b8);
  return;
}

Assistant:

void CommandExtract::OptionsExtract::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args.count(kOutput))
        outputPath = args[kOutput].as<std::string>();
    else
        report.fatal_usage("Missing output file or directory path.");

    const auto parseSelector = [&](const std::string& name, bool& found) -> std::optional<SelectorRange> {
        if (!args[name].count())
            return std::nullopt;
        const auto str = to_lower_copy(args[name].as<std::string>());
        try {
            found = true;
            return str == kAll ? SelectorRange(all) : SelectorRange(std::stoi(str));
        } catch (const std::invalid_argument&) {
            report.fatal_usage("Invalid {} value \"{}\". The value must be a either a number or \"all\".", name, str);
        } catch (const std::out_of_range& e) {
            report.fatal_usage("Out of range {} value \"{}\": {}.", name, str, e.what());
        }
        return std::nullopt;
    };

    auto level = parseSelector(kLevel, levelFlagUsed);
    auto layer = parseSelector(kLayer, layerFlagUsed);
    auto face = parseSelector(kFace, faceFlagUsed);
    auto depth_ = parseSelector(kDepth, depthFlagUsed);
    raw = args[kRaw].as<bool>();
    globalAll = args[kAll].as<bool>();

    if (globalAll) {
        if (level)
            report.fatal_usage("Conflicting options: --level cannot be used with --all.");
        if (layer)
            report.fatal_usage("Conflicting options: --layer cannot be used with --all.");
        if (face)
            report.fatal_usage("Conflicting options: --face cannot be used with --all.");
        if (depth_)
            report.fatal_usage("Conflicting options: --depth cannot be used with --all.");

        level = all;
        layer = all;
        face = all;
        depth_ = all;
    }

    if (globalAll && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--all' extract.");
    if (level == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--level all' extract.");
    if (layer == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--layer all' extract.");
    if (face == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--face all' extract.");
    if (depth_ == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--depth all' extract.");

    if (args[kUri].count()) {
        uriFlagUsed = true;

        if (globalAll)
            report.fatal_usage("Conflicting options: --all cannot be used with --uri.");
        if (levelFlagUsed)
            report.fatal_usage("Conflicting options: --level cannot be used with --uri.");
        if (layerFlagUsed)
            report.fatal_usage("Conflicting options: --layer cannot be used with --uri.");
        if (faceFlagUsed)
            report.fatal_usage("Conflicting options: --face cannot be used with --uri.");

        try {
            fragmentURI = parseFragmentURI(args[kUri].as<std::string>());
        } catch (const std::exception& e) {
            report.fatal_usage("Failed to parse Fragment URI: {}", e.what());
        }

        const auto isMultiOutputFragmentURI =
                (!fragmentURI.mip.is_undefined() && fragmentURI.mip.is_multi()) ||
                (!fragmentURI.stratal.is_undefined() && fragmentURI.stratal.is_multi()) ||
                (!fragmentURI.facial.is_undefined() && fragmentURI.facial.is_multi());
        if (isMultiOutputFragmentURI && outputPath == "-")
            report.fatal_usage("stdout cannot be used with multi-output '--uri' extract.");

    } else {
        // Merge every other selection method into the fragmentURI
        fragmentURI.mip = level.value_or(SelectorRange(0));
        fragmentURI.stratal = layer.value_or(SelectorRange(0));
        fragmentURI.facial = face.value_or(SelectorRange(0));
    }

    this->depth = depth_.value_or(SelectorRange(0));
}